

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Integer lua_tointeger(lua_State *L,int idx)

{
  int iVar1;
  double local_38;
  lua_Number n;
  TValue tmp;
  cTValue *o;
  lua_State *plStack_18;
  int idx_local;
  lua_State *L_local;
  
  o._4_4_ = idx;
  plStack_18 = L;
  tmp = (TValue)index2adr(L,idx);
  if ((uint)((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf) < 0xfffffff2) {
    local_38 = *(double *)tmp;
LAB_001147c3:
    L_local = (lua_State *)(long)local_38;
  }
  else {
    if ((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf == -5) {
      iVar1 = lj_strscan_num((GCstr *)(*(ulong *)tmp & 0x7fffffffffff),(TValue *)&n);
      if (iVar1 != 0) {
        local_38 = n;
        goto LAB_001147c3;
      }
    }
    L_local = (lua_State *)0x0;
  }
  return (lua_Integer)L_local;
}

Assistant:

LUA_API lua_Integer lua_tointeger(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp)))
      return 0;
    if (tvisint(&tmp))
      return intV(&tmp);
    n = numV(&tmp);
  }
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}